

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

int SSL_get_dtls_write_traffic_secret(SSL *ssl,uint8_t **out_data,size_t *out_len,uint16_t epoch)

{
  int iVar1;
  uint16_t epoch_local;
  size_t *out_len_local;
  uint8_t **out_data_local;
  SSL *ssl_local;
  
  iVar1 = get_dtls_traffic_secret<bssl::DTLSWriteEpoch>
                    (ssl,bssl::dtls_get_write_epoch,out_data,out_len,epoch);
  return iVar1;
}

Assistant:

int SSL_get_dtls_write_traffic_secret(const SSL *ssl, const uint8_t **out_data,
                                      size_t *out_len, uint16_t epoch) {
  return get_dtls_traffic_secret(ssl, dtls_get_write_epoch, out_data, out_len,
                                 epoch);
}